

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

xmlChar * xmlBufDetach(xmlBufPtr buf)

{
  xmlChar *pxVar1;
  
  if ((((buf != (xmlBufPtr)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) &&
      (buf->buffer == (xmlBufferPtr)0x0)) && (buf->error == 0)) {
    pxVar1 = buf->content;
    buf->content = (xmlChar *)0x0;
    buf->compat_use = 0;
    buf->compat_size = 0;
    buf->use = 0;
    buf->size = 0;
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlBufDetach(xmlBufPtr buf) {
    xmlChar *ret;

    if (buf == NULL)
        return(NULL);
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE)
        return(NULL);
    if (buf->buffer != NULL)
        return(NULL);
    if (buf->error)
        return(NULL);

    ret = buf->content;
    buf->content = NULL;
    buf->size = 0;
    buf->use = 0;
    UPDATE_COMPAT(buf);

    return ret;
}